

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

PField * __thiscall PClass::AddField(PClass *this,FName *name,PType *type,DWORD flags)

{
  uint uVar1;
  PField *pPVar2;
  BYTE *pBVar3;
  TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_> *pTVar4;
  FName local_24;
  
  uVar1 = *(uint *)&(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                    super_DObject.field_0x24;
  pPVar2 = PStruct::AddField(&this->super_PStruct,&local_24,type,flags);
  if (pPVar2 != (PField *)0x0) {
    pBVar3 = (BYTE *)M_Realloc_Dbg(this->Defaults,
                                   (ulong)*(uint *)&(this->super_PStruct).super_PNamedType.
                                                    super_PCompoundType.super_PType.super_DObject.
                                                    field_0x24,
                                   "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                                   ,0xcdd);
    this->Defaults = pBVar3;
    memset(pBVar3 + uVar1,0,
           (ulong)(*(int *)&(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                            super_DObject.field_0x24 - uVar1));
    pTVar4 = (TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>
              *)0x0;
    if (this->bRuntimeClass != false) {
      pTVar4 = &this->SpecialInits;
    }
    (*(type->super_DObject)._vptr_DObject[9])(type,this->Defaults,(ulong)pPVar2->Offset,pTVar4);
  }
  return pPVar2;
}

Assistant:

PField *PClass::AddField(FName name, PType *type, DWORD flags)
{
	unsigned oldsize = Size;
	PField *field = Super::AddField(name, type, flags);
	if (field != NULL)
	{
	Defaults = (BYTE *)M_Realloc(Defaults, Size);
	memset(Defaults + oldsize, 0, Size - oldsize);
		// If this is a native class, then we must not initialize and
		// destroy any of its members. We do, however, initialize the
		// default instance since it's not a normal instance of the class.
		type->SetDefaultValue(Defaults, field->Offset,
			bRuntimeClass ? &SpecialInits : NULL);
	}
	return field;
}